

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util_lite.cc
# Opt level: O0

void google::protobuf::TestUtilLite::ModifyPackedFields(TestPackedTypesLite *message)

{
  TestPackedTypesLite *message_local;
  
  proto2_unittest::TestPackedTypesLite::set_packed_int32(message,1,0x321);
  proto2_unittest::TestPackedTypesLite::set_packed_int64(message,1,0x322);
  proto2_unittest::TestPackedTypesLite::set_packed_uint32(message,1,0x323);
  proto2_unittest::TestPackedTypesLite::set_packed_uint64(message,1,0x324);
  proto2_unittest::TestPackedTypesLite::set_packed_sint32(message,1,0x325);
  proto2_unittest::TestPackedTypesLite::set_packed_sint64(message,1,0x326);
  proto2_unittest::TestPackedTypesLite::set_packed_fixed32(message,1,0x327);
  proto2_unittest::TestPackedTypesLite::set_packed_fixed64(message,1,0x328);
  proto2_unittest::TestPackedTypesLite::set_packed_sfixed32(message,1,0x329);
  proto2_unittest::TestPackedTypesLite::set_packed_sfixed64(message,1,0x32a);
  proto2_unittest::TestPackedTypesLite::set_packed_float(message,1,811.0);
  proto2_unittest::TestPackedTypesLite::set_packed_double(message,1,812.0);
  proto2_unittest::TestPackedTypesLite::set_packed_bool(message,1,true);
  proto2_unittest::TestPackedTypesLite::set_packed_enum(message,1,FOREIGN_LITE_FOO);
  return;
}

Assistant:

void TestUtilLite::ModifyPackedFields(unittest::TestPackedTypesLite* message) {
  message->set_packed_int32(1, 801);
  message->set_packed_int64(1, 802);
  message->set_packed_uint32(1, 803);
  message->set_packed_uint64(1, 804);
  message->set_packed_sint32(1, 805);
  message->set_packed_sint64(1, 806);
  message->set_packed_fixed32(1, 807);
  message->set_packed_fixed64(1, 808);
  message->set_packed_sfixed32(1, 809);
  message->set_packed_sfixed64(1, 810);
  message->set_packed_float(1, 811);
  message->set_packed_double(1, 812);
  message->set_packed_bool(1, true);
  message->set_packed_enum(1, unittest::FOREIGN_LITE_FOO);
}